

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LogicalNotLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_logicalnot(NeuralNetworkLayer *this)

{
  bool bVar1;
  LogicalNotLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_logicalnot(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_logicalnot(this);
    this_00 = (LogicalNotLayerParams *)operator_new(0x18);
    LogicalNotLayerParams::LogicalNotLayerParams(this_00);
    (this->layer_).logicalnot_ = this_00;
  }
  return (LogicalNotLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LogicalNotLayerParams* NeuralNetworkLayer::mutable_logicalnot() {
  if (!has_logicalnot()) {
    clear_layer();
    set_has_logicalnot();
    layer_.logicalnot_ = new ::CoreML::Specification::LogicalNotLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.logicalNot)
  return layer_.logicalnot_;
}